

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageColorBrightness(Image *image,int brightness)

{
  Color *pCVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uchar uVar7;
  int iVar8;
  uchar uVar9;
  int iVar10;
  int i;
  long lVar11;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    iVar4 = -0xff;
    if (-0xff < brightness) {
      iVar4 = brightness;
    }
    if (0xfe < iVar4) {
      iVar4 = 0xff;
    }
    pCVar1 = LoadImageColors(*image);
    for (lVar11 = 0; lVar11 < (long)image->height * (long)image->width; lVar11 = lVar11 + 1) {
      iVar2 = (uint)pCVar1[lVar11].r + iVar4;
      iVar3 = (uint)pCVar1[lVar11].g + iVar4;
      iVar5 = (uint)pCVar1[lVar11].b + iVar4;
      iVar6 = 0xff;
      if (iVar2 < 0xff) {
        iVar6 = iVar2;
      }
      iVar8 = 0xff;
      if (iVar3 < 0xff) {
        iVar8 = iVar3;
      }
      iVar10 = 0xff;
      if (iVar5 < 0xff) {
        iVar10 = iVar5;
      }
      uVar9 = (uchar)iVar6;
      if (iVar2 < 0) {
        uVar9 = '\x01';
      }
      uVar7 = (uchar)iVar8;
      if (iVar3 < 0) {
        uVar7 = '\x01';
      }
      pCVar1[lVar11].r = uVar9;
      pCVar1[lVar11].g = uVar7;
      uVar9 = (uchar)iVar10;
      if (iVar5 < 0) {
        uVar9 = '\x01';
      }
      pCVar1[lVar11].b = uVar9;
    }
    iVar4 = image->format;
    free(image->data);
    image->data = pCVar1;
    image->format = 7;
    ImageFormat(image,iVar4);
    return;
  }
  return;
}

Assistant:

void ImageColorBrightness(Image *image, int brightness)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (brightness < -255) brightness = -255;
    if (brightness > 255) brightness = 255;

    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        int cR = pixels[i].r + brightness;
        int cG = pixels[i].g + brightness;
        int cB = pixels[i].b + brightness;

        if (cR < 0) cR = 1;
        if (cR > 255) cR = 255;

        if (cG < 0) cG = 1;
        if (cG > 255) cG = 255;

        if (cB < 0) cB = 1;
        if (cB > 255) cB = 255;

        pixels[i].r = (unsigned char)cR;
        pixels[i].g = (unsigned char)cG;
        pixels[i].b = (unsigned char)cB;
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}